

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::BinaryOp_x86_functor::binary_op_div>
              (Mat *a,float b,Option *opt)

{
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  __m128 afVar2;
  __m128 _p;
  __m128 _b;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_div op;
  Mat *m;
  __m128 local_198;
  float local_188 [5];
  int local_174;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_158;
  long local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined8 local_130;
  float *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  binary_op_div local_101 [13];
  float local_f4;
  long *local_f0;
  undefined8 *local_e8;
  undefined1 local_dd;
  int local_dc;
  undefined8 *local_d0;
  undefined8 *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  __m128 *pafStack_a0;
  undefined8 local_98;
  float afStack_90 [4];
  __m128 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  float *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined8 *local_18;
  
  local_108 = *(int *)((long)in_RDI + 0x2c);
  local_10c = (int)in_RDI[6];
  local_110 = *(int *)((long)in_RDI + 0x34);
  local_114 = (int)in_RDI[7];
  local_118 = (int)in_RDI[3];
  local_11c = local_108 * local_10c * local_110 * local_118;
  local_f4 = in_XMM0_Da;
  local_f0 = in_RDI;
  for (local_120 = 0; local_120 < local_114; local_120 = local_120 + 1) {
    local_d0 = &local_170;
    local_4c = *(int *)((long)local_f0 + 0x2c);
    local_50 = (int)local_f0[6];
    local_54 = *(undefined4 *)((long)local_f0 + 0x34);
    local_128 = (float *)(*local_f0 + local_f0[8] * (long)local_120 * local_f0[2]);
    local_68 = local_f0[2];
    local_6c = (undefined4)local_f0[3];
    local_78 = local_f0[4];
    local_48 = &local_170;
    local_38 = (long)local_4c * (long)local_50 * local_68;
    local_c0 = &local_170;
    local_e8 = &local_170;
    local_3c = 0x10;
    local_dc = local_120;
    local_dd = 1;
    local_170 = 0;
    local_160 = 0;
    local_158 = 0;
    local_148 = 0;
    local_144 = 0;
    local_140 = 0;
    local_13c = 0;
    local_138 = 0;
    local_130 = 0;
    local_168 = 0;
    local_a8 = local_f4;
    local_b8 = local_f4;
    fStack_b4 = local_f4;
    fStack_b0 = local_f4;
    fStack_ac = local_f4;
    local_60 = local_128;
    local_18 = local_e8;
    local_150 = local_78;
    for (local_174 = 0; local_174 + 3 < local_11c; local_174 = local_174 + 4) {
      pafStack_a0 = (__m128 *)local_128;
      local_198 = *(__m128 *)local_128;
      afVar2 = BinaryOp_x86_functor::binary_op_div::func_pack4
                         (local_101,&local_198,(__m128 *)local_188);
      local_98 = afVar2._0_8_;
      afVar2[2] = (float)extraout_XMM0_Dc;
      afVar2[0] = (float)(int)local_98;
      afVar2[1] = (float)(int)((ulong)local_98 >> 0x20);
      afVar2[3] = extraout_XMM0_Dd;
      local_80 = (__m128 *)local_128;
      local_198._8_8_ = afVar2._8_8_;
      afStack_90[0] = local_198[2];
      afStack_90[1] = local_198[3];
      *(undefined8 *)local_128 = local_98;
      *(undefined8 *)(local_128 + 2) = local_198._8_8_;
      local_128 = (float *)((long)local_128 + 0x10);
      local_198 = afVar2;
    }
    for (; local_174 < local_11c; local_174 = local_174 + 1) {
      fVar1 = BinaryOp_x86_functor::binary_op_div::func(local_101,local_128,&local_f4);
      *local_128 = fVar1;
      local_128 = local_128 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps((float)b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr, b);
            ptr++;
        }
    }

    return 0;
}